

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdCombinePsbt(void *handle,void *psbt_handle,char *psbt_combine_base64)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  Psbt combine_psbt;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  string *in_stack_fffffffffffffe08;
  Psbt *in_stack_fffffffffffffe10;
  string *in_stack_fffffffffffffe20;
  allocator *paVar3;
  undefined8 in_stack_fffffffffffffe28;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe30;
  CfdException *this;
  allocator local_189;
  string local_188 [32];
  Psbt local_168;
  undefined6 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1e;
  exception in_stack_ffffffffffffff1f;
  void *in_stack_ffffffffffffff20;
  CfdSourceLocation local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  long local_68;
  allocator local_59;
  string local_58 [52];
  undefined4 local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"PsbtHandle",&local_59);
  cfd::capi::CheckBuffer
            (in_stack_ffffffffffffff20,
             (string *)
             CONCAT17(in_stack_ffffffffffffff1f,
                      CONCAT16(in_stack_ffffffffffffff1e,in_stack_ffffffffffffff18)));
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x1ec;
    local_80.funcname = "CfdCombinePsbt";
    cfd::core::logger::warn<>(&local_80,"psbt_combine_base64 is null or empty.");
    local_a2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a0,"Failed to parameter. psbt_combine_base64 is null or empty.",&local_a1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe30,error_code,in_stack_fffffffffffffe20);
    local_a2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_68 + 0x18) == 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x1f2;
    local_c0.funcname = "CfdCombinePsbt";
    cfd::core::logger::warn<>(&local_c0,"psbt is null.");
    uVar2 = __cxa_allocate_exception(0x30);
    this = (CfdException *)&stack0xffffffffffffff1f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff20,"Failed to handle statement. psbt is null.",
               (allocator *)this);
    cfd::core::CfdException::CfdException
              (this,(CfdError)((ulong)uVar2 >> 0x20),in_stack_fffffffffffffe20);
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar3 = &local_189;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,local_20,paVar3);
  cfd::Psbt::Psbt(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  cfd::core::Psbt::Combine(*(Psbt **)(local_68 + 0x18),&local_168);
  local_4 = 0;
  cfd::Psbt::~Psbt(in_stack_fffffffffffffe10);
  return local_4;
}

Assistant:

int CfdCombinePsbt(
    void* handle, void* psbt_handle, const char* psbt_combine_base64) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(psbt_combine_base64)) {
      warn(CFD_LOG_SOURCE, "psbt_combine_base64 is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. psbt_combine_base64 is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Psbt combine_psbt(psbt_combine_base64);
    psbt_obj->psbt->Combine(combine_psbt);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}